

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_g_Module.cpp
# Opt level: O2

bool __thiscall axl::g::Module::addFinalizer(Module *this,Ptr<axl::g::Finalizer> *finalizer)

{
  FinalizerEntry *p;
  EVP_PKEY_CTX *src;
  
  p = (FinalizerEntry *)operator_new(0x20);
  (p->m_finalizer).m_p = (Finalizer *)0x0;
  (p->m_finalizer).m_refCount = (RefCount *)0x0;
  rc::Ptr<axl::g::Finalizer>::copy(&p->m_finalizer,(EVP_PKEY_CTX *)finalizer,src);
  pthread_mutex_lock((pthread_mutex_t *)&this->m_finalizerListLock);
  sl::
  ListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>_>
  ::insertTail((ListBase<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::g::Module::FinalizerEntry,_axl::sl::ImplicitPtrCast<axl::g::Module::FinalizerEntry,_axl::sl::ListLink>_>_>
                *)&this->m_finalizerList,p);
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_finalizerListLock);
  return true;
}

Assistant:

bool
Module::addFinalizer(const rc::Ptr<Finalizer>& finalizer) {
	FinalizerEntry* finalizerEntry = new FinalizerEntry;
	finalizerEntry->m_finalizer = finalizer;

	m_finalizerListLock.lock();
	m_finalizerList.insertTail(finalizerEntry);
	m_finalizerListLock.unlock();
	return true;
}